

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_fclose(Context *context,IntrinsicResult partialResult)

{
  Value *this;
  Value fileWrapper;
  Value local_68;
  Value self;
  String local_48;
  Value local_38;
  Value local_28;
  
  MiniScript::String::String(&local_48,"self");
  MiniScript::Context::GetVar((Context *)&self,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  MiniScript::String::release(&local_48);
  MiniScript::Value::Value(&local_68,&_handle);
  MiniScript::Value::Lookup(&fileWrapper,&self);
  MiniScript::Value::~Value(&local_68);
  if (fileWrapper.type == Handle) {
    if ((FILE *)fileWrapper.data.ref[1]._vptr_RefCountedStorage == (FILE *)0x0) {
      this = &local_28;
      MiniScript::Value::Value(this,(Value *)MiniScript::Value::zero);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,this,true);
    }
    else {
      fclose((FILE *)fileWrapper.data.ref[1]._vptr_RefCountedStorage);
      fileWrapper.data.ref[1]._vptr_RefCountedStorage = (_func_int **)0x0;
      this = &local_38;
      MiniScript::Value::Value(this,(Value *)MiniScript::Value::one);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,this,true);
    }
    MiniScript::Value::~Value(this);
  }
  else {
    MiniScript::IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  MiniScript::Value::~Value(&fileWrapper);
  MiniScript::Value::~Value(&self);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_fclose(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult(Value::zero);
	fclose(handle);
	storage->f = nullptr;
	return IntrinsicResult(Value::one);
}